

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O0

pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> __thiscall
booster::aio::buffer_impl<const_char_*>::get(buffer_impl<const_char_*> *this)

{
  pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> pVar1;
  vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  *in_RDI;
  buffer_data_type bt;
  size_type local_38;
  const_reference local_30;
  int local_24;
  entry *local_20 [2];
  pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> local_10;
  
  if (*(int *)&(in_RDI->
               super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
               )._M_impl.super__Vector_impl_data._M_start == 0) {
    std::pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long>::
    pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long,_true>(&local_10);
    local_10.first = (entry *)0x0;
    local_10.second = 0;
  }
  else if (*(int *)&(in_RDI->
                    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    )._M_impl.super__Vector_impl_data._M_start == 1) {
    local_20[0] = (entry *)&(in_RDI->
                            super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
    local_24 = 1;
    std::pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long>::
    pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_int,_true>
              (&local_10,local_20,&local_24);
  }
  else {
    local_30 = std::
               vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
               ::front(in_RDI);
    local_38 = std::
               vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
               ::size(in_RDI + 1);
    std::pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long>::
    pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long,_true>
              (&local_10,&local_30,&local_38);
  }
  pVar1.second = local_10.second;
  pVar1.first = local_10.first;
  return pVar1;
}

Assistant:

std::pair<entry const *,size_t> get() const
			{
				if(size_ == 0) {
					buffer_data_type bt;
					bt.first=0;
					bt.second=0;
					return bt;
				}
				else if(size_ == 1)
					return buffer_data_type(&entry_,1);
				else
					return buffer_data_type(&vec_.front(),vec_.size());
			}